

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

void __thiscall
helics::CommonCore::setQueryCallback
          (CommonCore *this,LocalFederateId federateID,
          function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
          *queryFunction,int order)

{
  _Manager_type p_Var1;
  FederateState *this_00;
  InvalidIdentifier *this_01;
  string_view message;
  _Any_data local_38;
  _Manager_type local_28;
  _Invoker_type local_20;
  
  this_00 = getFederateAt(this,federateID);
  if (this_00 != (FederateState *)0x0) {
    local_38._M_unused._M_object = (void *)0x0;
    local_38._8_8_ = 0;
    local_28 = (_Manager_type)0x0;
    local_20 = queryFunction->_M_invoker;
    p_Var1 = (queryFunction->super__Function_base)._M_manager;
    if (p_Var1 != (_Manager_type)0x0) {
      local_38._M_unused._0_8_ =
           (undefined8)*(undefined8 *)&(queryFunction->super__Function_base)._M_functor;
      local_38._8_8_ = *(undefined8 *)((long)&(queryFunction->super__Function_base)._M_functor + 8);
      (queryFunction->super__Function_base)._M_manager = (_Manager_type)0x0;
      queryFunction->_M_invoker = (_Invoker_type)0x0;
      local_28 = p_Var1;
    }
    FederateState::setQueryCallback
              (this_00,(function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
                        *)&local_38,order);
    CLI::std::_Function_base::~_Function_base((_Function_base *)&local_38);
    return;
  }
  this_01 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
  message._M_str = "FederateID is invalid (setQueryCallback)";
  message._M_len = 0x28;
  InvalidIdentifier::InvalidIdentifier(this_01,message);
  __cxa_throw(this_01,&InvalidIdentifier::typeinfo,HelicsException::~HelicsException);
}

Assistant:

void CommonCore::setQueryCallback(LocalFederateId federateID,
                                  std::function<std::string(std::string_view)> queryFunction,
                                  int order)
{
    auto* fed = getFederateAt(federateID);
    if (fed == nullptr) {
        throw(InvalidIdentifier("FederateID is invalid (setQueryCallback)"));
    }
    fed->setQueryCallback(std::move(queryFunction), order);
}